

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O2

void __thiscall QButtonGroup::removeButton(QButtonGroup *this,QAbstractButton *button)

{
  QButtonGroupPrivate *this_00;
  Data *pDVar1;
  long lVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QAbstractButton *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QButtonGroupPrivate **)&this->field_0x8;
  pDVar1 = (this_00->checkedButton).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->checkedButton).wp.value;
  }
  local_28 = button;
  if (pQVar3 == (QObject *)button) {
    QButtonGroupPrivate::detectCheckedButton(this_00);
  }
  lVar2 = *(long *)&(button->super_QWidget).field_0x8;
  if (*(QButtonGroup **)(lVar2 + 0x290) == this) {
    *(undefined8 *)(lVar2 + 0x290) = 0;
    QtPrivate::sequential_erase_with_copy<QList<QAbstractButton*>,QAbstractButton*>
              (&this_00->buttonList,&local_28);
    QHash<QAbstractButton*,int>::removeImpl<QAbstractButton*>
              ((QHash<QAbstractButton*,int> *)&this_00->mapping,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QButtonGroup::removeButton(QAbstractButton *button)
{
    Q_D(QButtonGroup);
    if (d->checkedButton == button) {
        d->detectCheckedButton();
    }
    if (button->d_func()->group == this) {
        button->d_func()->group = nullptr;
        d->buttonList.removeAll(button);
        d->mapping.remove(button);
    }
}